

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O0

bool __thiscall sptk::ScalarOperation::AddLogarithmOperation(ScalarOperation *this,double base)

{
  OperationInterface *operation;
  long in_RDI;
  double in_XMM0_Qa;
  OperationPerformer *this_00;
  
  if (0.0 < in_XMM0_Qa) {
    operation = (OperationInterface *)(in_RDI + 0x10);
    this_00 = (OperationPerformer *)0x10;
    operator_new(0x10);
    operator_new((ulong)this_00);
    anon_unknown.dwarf_5ae6::Logarithm::Logarithm((Logarithm *)this_00,(double)operation);
    anon_unknown.dwarf_5ae6::OperationPerformer::OperationPerformer(this_00,operation);
    std::
    vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
    ::push_back((vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                 *)this_00,(value_type *)operation);
  }
  return 0.0 < in_XMM0_Qa;
}

Assistant:

bool ScalarOperation::AddLogarithmOperation(double base) {
  if (base <= 0.0) return false;
  modules_.push_back(new OperationPerformer(new Logarithm(base)));
  return true;
}